

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

Reader __thiscall capnp::_::OrphanBuilder::asDataReader(OrphanBuilder *this)

{
  SegmentBuilder **ppSVar1;
  byte bVar2;
  word *pwVar3;
  Arena *pAVar4;
  ReadLimiter *pRVar5;
  char cVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  char *pcVar12;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  SegmentBuilder **ppSVar13;
  uint uVar14;
  ulong uVar15;
  OrphanBuilder *pOVar16;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *this_00;
  bool bVar17;
  Reader RVar18;
  SegmentReader *newSegment;
  SegmentBuilder *local_68;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  Fault f_2;
  
  local_68 = this->segment;
  uVar14 = (uint)(this->tag).content;
  uVar11 = *(uint *)((long)&(this->tag).content + 4) | uVar14;
  if (uVar11 != 0) {
    pcVar12 = (char *)(ulong)CONCAT31((int3)(uVar11 >> 8),local_68 == (SegmentBuilder *)0x0);
    ppSVar13 = (SegmentBuilder **)this->location;
    pOVar16 = this;
    if ((uVar14 & 3) == 2 && local_68 != (SegmentBuilder *)0x0) {
      iVar7 = (*((local_68->super_SegmentReader).arena)->_vptr_Arena[2])();
      local_68 = (SegmentBuilder *)CONCAT44(extraout_var,iVar7);
      _kjCondition.left = (SegmentReader **)&local_68;
      _kjCondition.right = (void *)0x0;
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = local_68 != (SegmentBuilder *)0x0;
      if (local_68 == (SegmentBuilder *)0x0) {
        this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                  ((Fault *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x244,FAILED,"segment != nullptr",
                   "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition
                   ,(char (*) [49])"Message contains far pointer to unknown segment.");
      }
      else {
        uVar14 = (uint)(this->tag).content;
        uVar8 = (ulong)(uVar14 >> 3);
        uVar10 = (local_68->super_SegmentReader).ptr.size_;
        if ((long)uVar10 < (long)uVar8) {
          uVar8 = uVar10;
        }
        pOVar16 = (OrphanBuilder *)((local_68->super_SegmentReader).ptr.ptr + uVar8);
        if (local_68 == (SegmentBuilder *)0x0) {
          newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,1);
LAB_001996e0:
          if (((this->tag).content & 4) == 0) {
            ppSVar1 = &pOVar16->segment;
            lVar9 = (long)((int)(pOVar16->tag).content >> 2);
            if (local_68 == (SegmentBuilder *)0x0) {
              pcVar12 = (char *)0x0;
              ppSVar13 = ppSVar1 + lVar9;
            }
            else {
              pwVar3 = (local_68->super_SegmentReader).ptr.ptr;
              pcVar12 = (char *)(local_68->super_SegmentReader).ptr.size_;
              ppSVar13 = (SegmentBuilder **)(pwVar3 + (long)pcVar12);
              if ((long)pwVar3 - (long)ppSVar1 >> 3 <= lVar9) {
                pcVar12 = (char *)((long)ppSVar13 - (long)ppSVar1 >> 3);
                if (lVar9 <= (long)pcVar12) {
                  ppSVar13 = ppSVar1 + lVar9;
                }
              }
            }
            goto LAB_001998ac;
          }
          pAVar4 = (local_68->super_SegmentReader).arena;
          iVar7 = (*pAVar4->_vptr_Arena[2])
                            (pAVar4,(ulong)*(uint *)((long)&(pOVar16->tag).content + 4));
          newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar7);
          _kjCondition.left = &newSegment;
          _kjCondition.right = (void *)0x0;
          _kjCondition.op.content.ptr = " != ";
          _kjCondition.op.content.size_ = 5;
          _kjCondition.result = (SegmentBuilder *)newSegment != (SegmentBuilder *)0x0;
          if ((SegmentBuilder *)newSegment == (SegmentBuilder *)0x0) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                      (&f_2,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x25f,FAILED,"newSegment != nullptr",
                       "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                       &_kjCondition,
                       (char (*) [56])"Message contains double-far pointer to unknown segment.");
LAB_00199899:
            ppSVar13 = (SegmentBuilder **)0x0;
            kj::_::Debug::Fault::~Fault(&f_2);
            pcVar12 = extraout_RDX_00;
          }
          else {
            uVar14 = (uint)(pOVar16->tag).content & 3;
            _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar14);
            pcVar12 = " == ";
            _kjCondition.right = anon_var_dwarf_48f46;
            _kjCondition.op.content.ptr = (char *)0x5;
            _kjCondition.op.content.size_ = (size_t)(uVar14 == 2);
            if (uVar14 != 2) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                        (&f_2,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                         "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                         (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                          *)&_kjCondition,
                         (char (*) [51])"Second word of double-far pad must be far pointer.");
              goto LAB_00199899;
            }
            uVar8 = (ulong)((uint)(pOVar16->tag).content >> 3);
            uVar10 = (((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.size_;
            if ((long)uVar10 < (long)uVar8) {
              uVar8 = uVar10;
            }
            ppSVar13 = (SegmentBuilder **)
                       ((((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.ptr + uVar8);
            local_68 = (SegmentBuilder *)newSegment;
          }
          pOVar16 = (OrphanBuilder *)&pOVar16->segment;
          goto LAB_001998ac;
        }
        uVar15 = 2 - (ulong)((uVar14 & 4) == 0);
        if (uVar10 < uVar8 + uVar15) {
          newSegment = (SegmentReader *)((ulong)newSegment._1_7_ << 8);
        }
        else {
          pRVar5 = (local_68->super_SegmentReader).readLimiter;
          uVar10 = pRVar5->limit;
          if (uVar10 < uVar15) {
            (*((local_68->super_SegmentReader).arena)->_vptr_Arena[3])();
          }
          else {
            pRVar5->limit = uVar10 - uVar15;
          }
          newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,uVar15 <= uVar10);
          if (uVar15 <= uVar10) goto LAB_001996e0;
        }
        this_00 = &_kjCondition;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                  ((Fault *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                   "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                   ,(DebugExpression<bool> *)&newSegment,
                   (char (*) [318])
                   "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                  );
      }
      kj::_::Debug::Fault::~Fault((Fault *)this_00);
      pcVar12 = extraout_RDX;
      ppSVar13 = (SegmentBuilder **)0x0;
      pOVar16 = this;
    }
LAB_001998ac:
    if (ppSVar13 == (SegmentBuilder **)0x0) {
      cVar6 = (ppSVar13 == (SegmentBuilder **)0x0) * '\x02';
    }
    else {
      uVar14 = (uint)(pOVar16->tag).content & 3;
      _kjCondition.left = (SegmentReader **)CONCAT44(1,uVar14);
      _kjCondition.right = anon_var_dwarf_48f46;
      _kjCondition.op.content.ptr = (char *)0x5;
      _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar14 == 1);
      if (uVar14 == 1) {
        bVar2 = *(byte *)((long)&(pOVar16->tag).content + 4);
        _kjCondition.left =
             (SegmentReader **)(CONCAT71(_kjCondition.left._1_7_,bVar2) & 0xffffffffffffff07);
        _kjCondition.left._0_2_ = CONCAT11(2,_kjCondition.left._0_1_);
        _kjCondition.right = anon_var_dwarf_48f46;
        _kjCondition.op.content.ptr = (char *)0x5;
        bVar17 = (bVar2 & 7) == 2;
        _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar17);
        if (bVar17) {
          uVar14 = *(uint *)((long)&(pOVar16->tag).content + 4) >> 3;
          if (local_68 == (SegmentBuilder *)0x0) {
            bVar17 = true;
          }
          else {
            uVar10 = (ulong)(uVar14 + 7 >> 3);
            if ((local_68->super_SegmentReader).ptr.size_ <
                ((long)ppSVar13 - (long)(local_68->super_SegmentReader).ptr.ptr >> 3) + uVar10) {
              bVar17 = false;
            }
            else {
              pRVar5 = (local_68->super_SegmentReader).readLimiter;
              uVar8 = pRVar5->limit;
              bVar17 = uVar8 >= uVar10;
              if (uVar8 < uVar10) {
                (*((local_68->super_SegmentReader).arena)->_vptr_Arena[3])();
              }
              else {
                pRVar5->limit = uVar8 - uVar10;
              }
            }
          }
          newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,bVar17);
          cVar6 = '\x01';
          if (bVar17 == false) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                      ((Fault *)&_kjCondition,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x9e8,FAILED,"boundsCheck(segment, ptr, roundBytesUpToWords(size))",
                       "_kjCondition,\"Message contained out-of-bounds data pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                       ,(DebugExpression<bool> *)&newSegment,
                       (char (*) [320])
                       "Message contained out-of-bounds data pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                      );
            kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
            cVar6 = '\x02';
          }
          pcVar12 = (char *)(ulong)uVar14;
        }
        else {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&,char_const(&)[85]>
                    ((Fault *)&newSegment,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x9e2,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                     "_kjCondition,\"Schema mismatch: Message contains list pointer of non-bytes where data was \" \"expected.\""
                     ,(DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)&_kjCondition,
                     (char (*) [85])
                     "Schema mismatch: Message contains list pointer of non-bytes where data was expected."
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
          cVar6 = '\x02';
          pcVar12 = extraout_RDX_02;
        }
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[76]>
                  ((Fault *)&newSegment,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x9dc,FAILED,"ref->kind() == WirePointer::LIST",
                   "_kjCondition,\"Schema mismatch: Message contains non-list pointer where data was expected.\""
                   ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                    &_kjCondition,
                   (char (*) [76])
                   "Schema mismatch: Message contains non-list pointer where data was expected.");
        kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
        cVar6 = '\x02';
        pcVar12 = extraout_RDX_01;
      }
    }
    if (cVar6 != '\x02') goto LAB_00199a7a;
  }
  ppSVar13 = (SegmentBuilder **)0x0;
  pcVar12 = (char *)0x0;
LAB_00199a7a:
  RVar18.super_ArrayPtr<const_unsigned_char>.size_ = (size_t)pcVar12;
  RVar18.super_ArrayPtr<const_unsigned_char>.ptr = (uchar *)ppSVar13;
  return (Reader)RVar18.super_ArrayPtr<const_unsigned_char>;
}

Assistant:

Data::Reader OrphanBuilder::asDataReader() const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readDataPointer(segment, tagAsPtr(), location, nullptr, ZERO * BYTES);
}